

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<char>::write_int<unsigned_long_long,fmt::FormatSpec>
          (BasicWriter<char> *this,unsigned_long_long value,FormatSpec spec)

{
  undefined4 uVar1;
  lconv *plVar2;
  size_t __n;
  CharPtr __dest;
  long lVar3;
  byte *pbVar4;
  CharPtr pcVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  unsigned_long_long uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  undefined4 local_4c;
  long local_48;
  size_t local_40;
  char *local_38;
  
  uVar1 = spec._20_4_;
  local_4c = 0;
  uVar11 = 0;
  if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    bVar10 = 0x2b;
    if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
      bVar10 = 0x20;
    }
    local_4c = (uint)bVar10;
    uVar11 = 1;
  }
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_00155ed1;
      if (spec.type_ == 'B') {
LAB_00155de2:
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar6 = (ulong)uVar11;
          *(undefined1 *)((long)&local_4c + uVar6) = 0x30;
          uVar11 = uVar11 | 2;
          *(char *)((long)&local_4c + uVar6 + 1) = spec.type_;
        }
        uVar12 = 0;
        uVar9 = value;
        do {
          uVar12 = uVar12 + 1;
          bVar14 = 1 < uVar9;
          uVar9 = uVar9 >> 1;
        } while (bVar14);
        pbVar4 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                   (this,uVar12,&spec,(char *)&local_4c,uVar11);
        do {
          *pbVar4 = (byte)value & 1 | 0x30;
          pbVar4 = pbVar4 + -1;
          bVar14 = 1 < value;
          value = value >> 1;
        } while (bVar14);
        return;
      }
    }
    else {
      if (spec.type_ == 'X') goto LAB_00155e55;
      if (spec.type_ == 'b') goto LAB_00155de2;
    }
code_r0x00156017:
    internal::report_unknown_type(spec.super_AlignSpec.super_WidthSpec.fill_._3_1_,spec._8_8_);
  }
  if (0x6e < (byte)spec.type_) {
    if (spec.type_ == 'o') {
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar6 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
        *(undefined1 *)((long)&local_4c + uVar6) = 0x30;
      }
      uVar12 = 0;
      uVar9 = value;
      do {
        uVar12 = uVar12 + 1;
        bVar14 = 7 < uVar9;
        uVar9 = uVar9 >> 3;
      } while (bVar14);
      pbVar4 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                 (this,uVar12,&spec,(char *)&local_4c,uVar11);
      do {
        *pbVar4 = (byte)value & 7 | 0x30;
        pbVar4 = pbVar4 + -1;
        bVar14 = 7 < value;
        value = value >> 3;
      } while (bVar14);
      return;
    }
    if (spec.type_ == 'x') {
LAB_00155e55:
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar6 = (ulong)uVar11;
        *(undefined1 *)((long)&local_4c + uVar6) = 0x30;
        uVar11 = uVar11 | 2;
        *(char *)((long)&local_4c + uVar6 + 1) = spec.type_;
      }
      uVar12 = 0;
      uVar9 = value;
      do {
        uVar12 = uVar12 + 1;
        bVar14 = 0xf < uVar9;
        uVar9 = uVar9 >> 4;
      } while (bVar14);
      pcVar5 = prepare_int_buffer<fmt::FormatSpec>(this,uVar12,&spec,(char *)&local_4c,uVar11);
      pcVar8 = "0123456789ABCDEF";
      if (spec.type_ == 'x') {
        pcVar8 = "0123456789abcdef";
      }
      do {
        *pcVar5 = pcVar8[(uint)value & 0xf];
        pcVar5 = pcVar5 + -1;
        bVar14 = 0xf < value;
        value = value >> 4;
      } while (bVar14);
      return;
    }
    goto code_r0x00156017;
  }
  if (spec.type_ == 'd') {
LAB_00155ed1:
    lVar7 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    uVar12 = ((uint)lVar7 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    pcVar5 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar12 - (value < internal::BasicData<void>::POWERS_OF_10_64[uVar12]))
                             + 1,&spec,(char *)&local_4c,uVar11);
    pcVar5 = pcVar5 + 1;
    uVar6 = value;
    if (99 < value) {
      do {
        value = uVar6 / 100;
        *(undefined2 *)(pcVar5 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (ulong)(uint)((int)uVar6 + (int)value * -100) * 2);
        pcVar5 = pcVar5 + -2;
        bVar14 = 9999 < uVar6;
        uVar6 = value;
      } while (bVar14);
    }
    if (value < 10) {
      bVar10 = (byte)value | 0x30;
      lVar7 = -1;
    }
    else {
      pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [(value * 2 & 0xffffffff) + 1];
      bVar10 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               [value * 2 & 0x1fffffffe];
      lVar7 = -2;
    }
    pcVar5[lVar7] = bVar10;
    return;
  }
  if (spec.type_ != 'n') goto code_r0x00156017;
  lVar7 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar7 == 0; lVar7 = lVar7 + -1) {
    }
  }
  uVar12 = ((uint)lVar7 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  plVar2 = localeconv();
  local_38 = plVar2->thousands_sep;
  __n = strlen(local_38);
  uVar12 = uVar12 - (value < internal::BasicData<void>::POWERS_OF_10_64[uVar12]);
  __dest = prepare_int_buffer<fmt::FormatSpec>
                     (this,uVar12 + (int)__n * (uVar12 / 3) + 1,&spec,(char *)&local_4c,uVar11);
  pcVar5 = __dest + 1;
  if (value < 100) {
    if (9 < value) {
      uVar6 = (ulong)(uint)((int)value * 2);
      *__dest = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                [uVar6 + 1];
      goto LAB_0015604e;
    }
  }
  else {
    lVar7 = -__n;
    uVar11 = 0;
    local_48 = lVar7;
    local_40 = __n;
    do {
      uVar12 = uVar11;
      uVar6 = value;
      value = uVar6 / 100;
      uVar13 = (ulong)(uint)(((int)uVar6 + (int)value * -100) * 2);
      pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [uVar13 + 1];
      if ((uVar12 | 1) * -0x55555555 < 0x55555556) {
        pcVar5 = pcVar5 + lVar7 + -1;
        if (__n == 0) {
          pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                       [uVar13];
          lVar3 = 0;
          if ((uVar12 + 2) * -0x55555555 < 0x55555556) {
            lVar3 = lVar7;
          }
          pcVar5 = pcVar5 + lVar3 + -1;
        }
        else {
          memmove(pcVar5,local_38,__n);
          pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                       [uVar13];
          pcVar5 = pcVar5 + -1;
          lVar7 = local_48;
          __n = local_40;
          if ((uVar12 + 2) * -0x55555555 < 0x55555556) {
            pcVar5 = pcVar5 + local_48;
            goto LAB_00155d53;
          }
        }
      }
      else {
        pcVar5[-2] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [uVar13];
        pcVar5 = pcVar5 + -2;
        if (((uVar12 + 2) * -0x55555555 < 0x55555556) && (pcVar5 = pcVar5 + lVar7, __n != 0)) {
LAB_00155d53:
          memmove(pcVar5,local_38,__n);
          lVar7 = local_48;
          __n = local_40;
        }
      }
      uVar11 = uVar12 + 2;
    } while (9999 < uVar6);
    if (999 < uVar6) {
      uVar6 = (ulong)(uint)((int)value * 2);
      __dest = pcVar5 + -1;
      pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [uVar6 + 1];
      if ((uVar12 * -0x55555555 + 1 < 0x55555556) && (__dest = __dest + -__n, __n != 0)) {
        memmove(__dest,local_38,__n);
      }
LAB_0015604e:
      bVar10 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               [uVar6];
      pcVar5 = __dest;
      goto LAB_0015605a;
    }
  }
  bVar10 = (byte)value | 0x30;
LAB_0015605a:
  pcVar5[-1] = bVar10;
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}